

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

Symbol __thiscall
google::protobuf::DescriptorBuilder::LookupSymbol
          (DescriptorBuilder *this,string *name,string *relative_to,PlaceholderType placeholder_type
          ,ResolveMode resolve_mode,bool build_it)

{
  DescriptorPool *this_00;
  bool bVar1;
  StringPiece local_50;
  undefined1 local_31;
  ResolveMode local_30;
  PlaceholderType PStack_2c;
  bool build_it_local;
  ResolveMode resolve_mode_local;
  PlaceholderType placeholder_type_local;
  string *relative_to_local;
  string *name_local;
  DescriptorBuilder *this_local;
  Symbol result;
  
  local_31 = build_it;
  local_30 = resolve_mode;
  PStack_2c = placeholder_type;
  _resolve_mode_local = relative_to;
  relative_to_local = name;
  name_local = (string *)this;
  this_local = (DescriptorBuilder *)
               LookupSymbolNoPlaceholder(this,name,relative_to,resolve_mode,build_it);
  bVar1 = Symbol::IsNull((Symbol *)&this_local);
  if ((bVar1) && ((this->pool_->allow_unknown_ & 1U) != 0)) {
    this_00 = this->pool_;
    stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
              (&local_50,relative_to_local);
    this_local = (DescriptorBuilder *)
                 DescriptorPool::NewPlaceholderWithMutexHeld(this_00,local_50,PStack_2c);
  }
  return (Symbol)(SymbolBase *)this_local;
}

Assistant:

Symbol DescriptorBuilder::LookupSymbol(
    const std::string& name, const std::string& relative_to,
    DescriptorPool::PlaceholderType placeholder_type, ResolveMode resolve_mode,
    bool build_it) {
  Symbol result =
      LookupSymbolNoPlaceholder(name, relative_to, resolve_mode, build_it);
  if (result.IsNull() && pool_->allow_unknown_) {
    // Not found, but AllowUnknownDependencies() is enabled.  Return a
    // placeholder instead.
    result = pool_->NewPlaceholderWithMutexHeld(name, placeholder_type);
  }
  return result;
}